

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

Value __thiscall xmrig::CudaBackend::toJSON(CudaBackend *this,Document *doc)

{
  undefined1 uVar1;
  bool bVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  reference this_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  long *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  undefined1 auVar4 [16];
  Value VVar5;
  Value thread;
  CudaLaunchData *data;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *__range1;
  size_t i;
  Value threads;
  Value versions;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *in_stack_fffffffffffffd98;
  String *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Document *in_stack_fffffffffffffdb0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  String *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  StringRefType *in_stack_fffffffffffffe08;
  Document *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined8 in_stack_fffffffffffffe20;
  __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
  local_1c8;
  long local_1c0;
  long local_1b8;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_1a0;
  GenericStringRef<char> local_190;
  undefined4 local_17c;
  String local_178 [2];
  GenericStringRef<char> local_158 [2];
  GenericStringRef<char> local_138 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_118;
  GenericStringRef<char> local_108;
  string local_f8 [32];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_d8;
  GenericStringRef<char> local_c8;
  string local_b8 [32];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98;
  GenericStringRef<char> local_88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78;
  GenericStringRef<char> local_68;
  Document *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  GenericStringRef<char> local_38;
  byte local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_stack_fffffffffffffda0,(Type)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_38,(char (*) [5])0x27c7ac);
  (**(code **)(*in_RSI + 0x28))();
  String::toJSON(in_stack_fffffffffffffdb8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
            in_stack_fffffffffffffde8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffffb8);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_68,(char (*) [8])0x279127);
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
                  (bool)in_stack_fffffffffffffdf7,in_stack_fffffffffffffde8);
  bVar2 = CudaLib::isReady();
  if (bVar2) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffda0,(Type)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    rapidjson::GenericStringRef<char>::GenericStringRef<13u>
              (&local_88,(char (*) [13])"cuda-runtime");
    CudaLib::version_abi_cxx11_(in_stack_fffffffffffffe1c);
    std::__cxx11::string::c_str();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffdc0),(Ch *)in_stack_fffffffffffffdb8,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdb0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              in_stack_fffffffffffffde8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_98);
    std::__cxx11::string::~string(local_b8);
    rapidjson::GenericStringRef<char>::GenericStringRef<12u>(&local_c8,(char (*) [12])"cuda-driver")
    ;
    CudaLib::version_abi_cxx11_(in_stack_fffffffffffffe1c);
    std::__cxx11::string::c_str();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffdc0),(Ch *)in_stack_fffffffffffffdb8,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdb0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              in_stack_fffffffffffffde8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_d8);
    std::__cxx11::string::~string(local_f8);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_108,(char (*) [7])"plugin");
    CudaLib::pluginVersion();
    String::String((String *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    String::toJSON(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              in_stack_fffffffffffffde8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_118);
    String::~String(in_stack_fffffffffffffda0);
    bVar2 = NvmlLib::isReady();
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<5u>(local_138,(char (*) [5])0x27924c);
      NvmlLib::version();
      rapidjson::StringRef<char>((char *)in_stack_fffffffffffffd98);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&in_stack_fffffffffffffe10->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,in_stack_fffffffffffffe08,(StringRefType *)in_stack_fffffffffffffe00,
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdf8);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(local_158,(char (*) [7])0x27e631);
      NvmlLib::driverVersion();
      rapidjson::StringRef<char>((char *)in_stack_fffffffffffffd98);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&in_stack_fffffffffffffe10->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,in_stack_fffffffffffffe08,(StringRefType *)in_stack_fffffffffffffe00,
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdf8);
    }
    in_stack_fffffffffffffdb8 = local_178;
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>
              ((GenericStringRef<char> *)in_stack_fffffffffffffdb8,(char (*) [9])"versions");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
              in_stack_fffffffffffffde8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_78);
  }
  bVar2 = std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::empty
                    ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)
                     in_stack_fffffffffffffdb0);
  uVar3 = extraout_RDX;
  if (!bVar2) {
    auVar4 = (**(code **)(*in_RSI + 0x20))();
    uVar3 = auVar4._8_8_;
    value = auVar4._0_8_;
    if (value != (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)0x0) {
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_190,(char (*) [9])"hashrate");
      allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)(**(code **)(*in_RSI + 0x20))()
      ;
      Hashrate::toJSON((Hashrate *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe10);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                  in_stack_fffffffffffffde8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_1a0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffffda0,(Type)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      local_1b8 = 0;
      local_1c0 = in_RSI[1] + 0x40;
      local_1c8._M_current =
           (CudaLaunchData *)
           std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::begin
                     (in_stack_fffffffffffffd98);
      std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::end
                (in_stack_fffffffffffffd98);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
                                 *)in_stack_fffffffffffffda0,
                                (__normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
                                 *)in_stack_fffffffffffffd98), bVar2) {
        this_00 = __gnu_cxx::
                  __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
                  ::operator*(&local_1c8);
        CudaThread::toJSON((CudaThread *)in_stack_fffffffffffffe58,
                           (Document *)in_stack_fffffffffffffe50);
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>
                  ((GenericStringRef<char> *)&stack0xfffffffffffffe08,(char (*) [9])"hashrate");
        in_stack_fffffffffffffda0 = (String *)(**(code **)(*in_RSI + 0x20))();
        Hashrate::toJSON((Hashrate *)this_00,in_stack_fffffffffffffe20,
                         (Document *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                    in_stack_fffffffffffffde8);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&stack0xfffffffffffffdf8);
        CudaDevice::toJSON((CudaDevice *)in_stack_ffffffffffffffc0,
                           (Value *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        local_1b8 = local_1b8 + 1;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)in_stack_fffffffffffffdb8,value,allocator_00);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&stack0xfffffffffffffe18);
        __gnu_cxx::
        __normal_iterator<xmrig::CudaLaunchData_*,_std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>_>
        ::operator++(&local_1c8);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>
                ((GenericStringRef<char> *)&stack0xfffffffffffffde8,(char (*) [8])"threads");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffe00,(StringRefType *)in_stack_fffffffffffffdf8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                  in_stack_fffffffffffffde8);
      local_21 = 1;
      local_17c = 1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&stack0xfffffffffffffe50);
      uVar3 = extraout_RDX_00;
      goto LAB_00224111;
    }
  }
  local_21 = 1;
  local_17c = 1;
LAB_00224111:
  if ((local_21 & 1) == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(in_RDI);
    uVar3 = extraout_RDX_01;
  }
  VVar5.data_.s.str = (Ch *)uVar3;
  VVar5.data_.n = (Number)in_RDI;
  return (Value)VVar5.data_;
}

Assistant:

rapidjson::Value xmrig::CudaBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);

    if (CudaLib::isReady()) {
        Value versions(kObjectType);
        versions.AddMember("cuda-runtime",   Value(CudaLib::version(d_ptr->runtimeVersion).c_str(), allocator), allocator);
        versions.AddMember("cuda-driver",    Value(CudaLib::version(d_ptr->driverVersion).c_str(), allocator), allocator);
        versions.AddMember("plugin",         String(CudaLib::pluginVersion()).toJSON(doc), allocator);

#       ifdef XMRIG_FEATURE_NVML
        if (NvmlLib::isReady()) {
            versions.AddMember("nvml",       StringRef(NvmlLib::version()), allocator);
            versions.AddMember("driver",     StringRef(NvmlLib::driverVersion()), allocator);
        }
#       endif

        out.AddMember("versions", versions, allocator);
    }

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
        Value thread = data.thread.toJSON(doc);
        thread.AddMember("hashrate", hashrate()->toJSON(i, doc), allocator);

        data.device.toJSON(thread, doc);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}